

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O1

MergeResult
mergesort_lcp_2way_unstable_parallel<true>
          (uchar **strings_input,uchar **strings_output,lcp_t *lcp_input,lcp_t *lcp_output,size_t n)

{
  byte *pbVar1;
  lcp_t *lcp_output_00;
  byte *pbVar2;
  byte *pbVar3;
  int iVar4;
  bool bVar5;
  MergeResult MVar6;
  MergeResult MVar7;
  ostream *poVar8;
  uchar **ppuVar9;
  ulong uVar10;
  size_t n_00;
  ulong uVar11;
  uchar **ppuVar12;
  byte bVar13;
  lcp_t lVar14;
  lcp_t in_R9;
  long lVar15;
  char local_61;
  lcp_t *local_60;
  uchar **local_58;
  uchar **local_50;
  lcp_t *local_48;
  uchar **local_40;
  size_t local_38;
  
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"mergesort_lcp_2way_unstable_parallel",0x24);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"(): n=",6);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  local_61 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,&local_61,1);
  if (n < 0x20) {
    if (1 < (long)n) {
      uVar11 = n & 0xffffffff;
      ppuVar9 = strings_input;
      do {
        iVar4 = (int)uVar11;
        uVar11 = (ulong)(iVar4 - 1);
        pbVar2 = ppuVar9[1];
        ppuVar9 = ppuVar9 + 1;
        for (ppuVar12 = ppuVar9; strings_input < ppuVar12; ppuVar12 = ppuVar12 + -1) {
          pbVar3 = ppuVar12[-1];
          bVar13 = *pbVar3;
          in_R9 = CONCAT71((int7)(in_R9 >> 8),*pbVar2);
          if (bVar13 != 0 && bVar13 == *pbVar2) {
            lVar15 = 1;
            do {
              bVar13 = pbVar3[lVar15];
              pbVar1 = pbVar2 + lVar15;
              in_R9 = CONCAT71((int7)(in_R9 >> 8),*pbVar1);
              if (bVar13 == 0) break;
              lVar15 = lVar15 + 1;
            } while (bVar13 == *pbVar1);
          }
          if (bVar13 <= (byte)in_R9) break;
          *ppuVar12 = pbVar3;
        }
        *ppuVar12 = pbVar2;
      } while (2 < iVar4);
    }
    if (n != 1) {
      uVar11 = 0;
      do {
        uVar10 = (ulong)((int)uVar11 + 1);
        lVar15 = 0;
        lVar14 = 0;
        do {
          if ((strings_input[uVar11][lVar15] == '\0') ||
             (strings_input[uVar11][lVar15] != strings_input[uVar10][lVar15])) {
            bVar5 = false;
            in_R9 = lVar14;
          }
          else {
            lVar14 = lVar14 + 1;
            bVar5 = true;
          }
          lVar15 = lVar15 + 1;
        } while (bVar5);
        lcp_input[uVar11] = in_R9;
        uVar11 = uVar10;
      } while (uVar10 < n - 1);
    }
  }
  else {
    uVar11 = n >> 1;
    MVar6 = mergesort_lcp_2way_unstable_parallel<true>
                      (strings_input,strings_output,lcp_input,lcp_output,uVar11);
    local_58 = strings_input + uVar11;
    local_40 = strings_output + uVar11;
    local_60 = lcp_input + uVar11;
    lcp_output_00 = lcp_output + uVar11;
    n_00 = n - uVar11;
    local_50 = strings_output;
    local_48 = lcp_output;
    MVar7 = mergesort_lcp_2way_unstable_parallel<true>
                      (local_58,local_40,local_60,lcp_output_00,n_00);
    if (MVar6 != MVar7) {
      if (MVar6 != SortedInPlace) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x700,
                      "MergeResult mergesort_lcp_2way_unstable_parallel(unsigned char **__restrict, unsigned char **__restrict, lcp_t *__restrict, lcp_t *__restrict, size_t) [OutputLCP = true]"
                     );
      }
      local_38 = n_00 * 8;
      memcpy(local_58,local_40,local_38);
      memcpy(local_60,lcp_output_00,local_38);
    }
    if (MVar6 == SortedInPlace) {
      merge_lcp_2way_unstable<true>
                (strings_input,lcp_input,uVar11,local_58,local_60,n_00,local_50,local_48);
      return SortedInTemp;
    }
    merge_lcp_2way_unstable<true>
              (local_50,local_48,uVar11,local_40,lcp_output_00,n_00,strings_input,lcp_input);
  }
  return SortedInPlace;
}

Assistant:

MergeResult
mergesort_lcp_2way_unstable_parallel(unsigned char** restrict strings_input,
                            unsigned char** restrict strings_output,
                            lcp_t* restrict lcp_input,
                            lcp_t* restrict lcp_output,
                            size_t n)
{
	debug() << __func__ << "(): n=" << n << '\n';
	if (n < 32) {
		insertion_sort(strings_input, n, 0);
		for (unsigned i=0; i < n-1; ++i)
			lcp_input[i] = lcp(strings_input[i], strings_input[i+1]);
		return SortedInPlace;
	}
	const size_t split0 = n/2;
	MergeResult ml, mr;
#pragma omp task shared(ml)
	ml = mergesort_lcp_2way_unstable_parallel<true>(
			strings_input, strings_output,
			lcp_input,     lcp_output,
			split0);
#pragma omp task shared(mr)
	mr = mergesort_lcp_2way_unstable_parallel<true>(
			strings_input+split0, strings_output+split0,
			lcp_input+split0,     lcp_output+split0,
			n-split0);
#pragma omp taskwait
	if (ml != mr) {
		if (ml == SortedInPlace) {
			std::copy(strings_output+split0, strings_output+n,
					strings_input+split0);
			std::copy(lcp_output+split0, lcp_output+n,
					lcp_input+split0);
			mr = SortedInPlace;
		} else {
			assert(0);
			abort();
		}
	}
	if (ml == SortedInPlace) {
		merge_lcp_2way_unstable<OutputLCP>(
		           strings_input,        lcp_input,        split0,
		           strings_input+split0, lcp_input+split0, n-split0,
		           strings_output, lcp_output);
		return SortedInTemp;
	} else {
		merge_lcp_2way_unstable<OutputLCP>(
		           strings_output,        lcp_output,        split0,
		           strings_output+split0, lcp_output+split0, n-split0,
		           strings_input, lcp_input);
		return SortedInPlace;
	}
}